

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *cvode_mem,N_Vector tmp1,
             N_Vector tmp2,N_Vector tmp3)

{
  int iVar1;
  CVodeMem in_RCX;
  long in_RDX;
  int retval;
  CVodeMem cv_mem;
  N_Vector in_stack_00000050;
  N_Vector in_stack_00000058;
  N_Vector in_stack_000000b0;
  N_Vector in_stack_000000b8;
  CVodeMem in_stack_000000c0;
  SUNMatrix in_stack_000000c8;
  N_Vector in_stack_000000d0;
  N_Vector in_stack_000000d8;
  sunrealtype in_stack_000000e0;
  int local_4c;
  int local_4;
  
  if (in_RCX == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x42b,"cvLsDQJac",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDX == 0) {
    cvProcessError(in_RCX,-2,0x434,"cvLsDQJac",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else if ((((in_RCX->cv_tempv->ops->nvcloneempty == (_func_N_Vector_N_Vector *)0x0) ||
            (in_RCX->cv_tempv->ops->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) ||
           (in_RCX->cv_tempv->ops->nvlinearsum ==
            (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
          (((in_RCX->cv_tempv->ops->nvdestroy == (_func_void_N_Vector *)0x0 ||
            (in_RCX->cv_tempv->ops->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0)) ||
           ((in_RCX->cv_tempv->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0 ||
            (in_RCX->cv_tempv->ops->nvsetarraypointer == (_func_void_sunrealtype_ptr_N_Vector *)0x0)
            ))))) {
    cvProcessError(in_RCX,-3,0x442,"cvLsDQJac",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"A required vector operation is not implemented.");
    local_4 = -3;
  }
  else {
    iVar1 = SUNMatGetID(in_RDX);
    if (iVar1 == 0) {
      local_4c = cvLsDenseDQJac((sunrealtype)tmp3,in_stack_00000058,in_stack_00000050,(SUNMatrix)t,
                                (CVodeMem)y,fy);
    }
    else {
      iVar1 = SUNMatGetID(in_RDX);
      if (iVar1 == 3) {
        local_4c = cvLsBandDQJac(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                                 in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                                 in_stack_000000b0);
      }
      else {
        cvProcessError(in_RCX,-3,0x452,"cvLsDQJac",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                       ,"unrecognized matrix type for cvLsDQJac");
        local_4c = -3;
      }
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

int cvLsDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
              void* cvode_mem, N_Vector tmp1, N_Vector tmp2,
              SUNDIALS_MAYBE_UNUSED N_Vector tmp3)
{
  CVodeMem cv_mem;
  int retval;

  /* access CVodeMem structure */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }

  /* Verify that N_Vector supports required operations */
  if (cv_mem->cv_tempv->ops->nvcloneempty == NULL ||
      cv_mem->cv_tempv->ops->nvwrmsnorm == NULL ||
      cv_mem->cv_tempv->ops->nvlinearsum == NULL ||
      cv_mem->cv_tempv->ops->nvdestroy == NULL ||
      cv_mem->cv_tempv->ops->nvscale == NULL ||
      cv_mem->cv_tempv->ops->nvgetarraypointer == NULL ||
      cv_mem->cv_tempv->ops->nvsetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = cvLsDenseDQJac(t, y, fy, Jac, cv_mem, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = cvLsBandDQJac(t, y, fy, Jac, cv_mem, tmp1, tmp2);
  }
  else
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "unrecognized matrix type for cvLsDQJac");
    retval = CVLS_ILL_INPUT;
  }
  return (retval);
}